

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender fmt::v9::detail::write_int_noinline<char,fmt::v9::appender,unsigned_int>
                   (appender out,write_int_arg<unsigned_int> arg,basic_format_specs<char> *specs,
                   locale_ref loc)

{
  presentation_type pVar1;
  int iVar2;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  char *digits;
  appender aVar6;
  byte *pbVar7;
  char *pcVar8;
  size_t sVar9;
  long lVar10;
  write_int_arg<unsigned_int> wVar11;
  uint uVar12;
  uint uVar13;
  char *pcVar14;
  char *pcVar15;
  appender it;
  int iVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  format_decimal_result<char_*> fVar20;
  char buffer [10];
  undefined8 uStack_70;
  undefined1 local_68 [32];
  bool local_48;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_38;
  
  pVar1 = specs->type;
  local_38 = out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
  if (chr < pVar1) {
switchD_0012044b_caseD_7:
    uStack_70 = write_int_localized<fmt::v9::appender,unsigned_long,char>;
    throw_format_error("invalid type specifier");
  }
  uVar19 = (ulong)arg >> 0x20;
  uVar18 = arg.prefix;
  uVar12 = arg.abs_value;
  switch(pVar1) {
  case none:
  case dec:
    break;
  case oct:
    uVar13 = 0x1f;
    if ((uVar12 | 1) != 0) {
      for (; (uVar12 | 1) >> uVar13 == 0; uVar13 = uVar13 - 1) {
      }
    }
    uVar13 = uVar13 & 0xff;
    bVar4 = (char)(uVar13 * 0x56 >> 8) + 1;
    iVar2 = specs->precision;
    if (((char)*(ushort *)&specs->field_0x9 < '\0') && (uVar12 != 0 && iVar2 <= (int)(uint)bVar4)) {
      uVar12 = 0x3000;
      if (uVar19 == 0) {
        uVar12 = 0x30;
      }
      uVar19 = (ulong)((uVar12 | uVar18) + 0x1000000);
    }
    uVar18 = (uint)bVar4;
    uVar17 = (ulong)uVar18;
    uVar12 = specs->width;
    local_68._0_4_ = (undefined4)uVar19;
    if (iVar2 == -1 && uVar12 == 0) {
      if ((local_68._0_4_ != 0) && (uVar12 = local_68._0_4_ & 0xffffff, (uVar19 & 0xffffff) != 0)) {
        do {
          lVar10 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                   container + 0x10);
          uVar19 = lVar10 + 1;
          if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                               container + 0x18) < uVar19) {
            uStack_70 = (code *)0x1209c4;
            (*(code *)**(undefined8 **)
                        out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)
                      (out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container);
            lVar10 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                     container + 0x10);
            uVar19 = lVar10 + 1;
          }
          *(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container
                    + 0x10) = uVar19;
          *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                    container + 8) + lVar10) = (char)uVar12;
          bVar3 = 0xff < uVar12;
          uVar12 = uVar12 >> 8;
        } while (bVar3);
      }
      lVar10 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                               container + 0x10);
      uVar19 = lVar10 + uVar17;
      if (uVar19 <= *(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                     container + 0x18)) {
        *(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container +
                  0x10) = uVar19;
        if (*(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container
                     + 8) != 0) {
          pbVar7 = (byte *)(*(long *)((long)out.
                                            super_back_insert_iterator<fmt::v9::detail::buffer<char>_>
                                            .container + 8) + lVar10 + (ulong)uVar13 / 3);
          wVar11 = (write_int_arg<unsigned_int>)((ulong)arg & 0xffffffff);
          do {
            uVar12 = arg.abs_value;
            *pbVar7 = (byte)arg.abs_value & 7 | 0x30;
            wVar11 = (write_int_arg<unsigned_int>)((ulong)wVar11 >> 3);
            pbVar7 = pbVar7 + -1;
            arg = wVar11;
          } while (7 < uVar12);
          return (appender)
                 out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
        }
      }
      pcVar8 = local_68 + uVar17;
      pbVar7 = local_68 + (ulong)uVar13 / 3;
      wVar11 = (write_int_arg<unsigned_int>)((ulong)arg & 0xffffffff);
      do {
        uVar12 = arg.abs_value;
        *pbVar7 = (byte)arg.abs_value & 7 | 0x30;
        wVar11 = (write_int_arg<unsigned_int>)((ulong)wVar11 >> 3);
        pbVar7 = pbVar7 + -1;
        arg = wVar11;
      } while (7 < uVar12);
      goto LAB_00120aaa;
    }
    iVar16 = (int)(uVar19 >> 0x18);
    uVar13 = iVar16 + (uint)bVar4;
    local_68._8_8_ = ZEXT48(uVar13);
    if ((*(ushort *)&specs->field_0x9 & 0xf) == 4) {
      if (uVar13 < uVar12) {
        local_68._16_8_ = (ulong)uVar12 - local_68._8_8_;
        local_68._8_8_ = (ulong)uVar12;
        goto LAB_00120a4a;
      }
    }
    else {
      local_68._16_8_ = ZEXT48(iVar2 - uVar18);
      if (iVar2 - uVar18 != 0 && (int)uVar18 <= iVar2) {
        local_68._8_8_ = ZEXT48((uint)(iVar2 + iVar16));
        goto LAB_00120a4a;
      }
    }
    local_68._16_8_ = 0;
LAB_00120a4a:
    local_68._24_8_ = uVar17 << 0x20 | (ulong)arg & 0xffffffff;
    uStack_70 = (code *)0x120a70;
    aVar6 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::write_int<fmt::v9::appender,char,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned_int>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned_int>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_4_>(fmt::v9::appender,int,unsigned_int,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned_int>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned_int>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_4_)::_lambda(fmt::v9::appender)_1_&>
                      (out,specs,local_68._8_8_,local_68._8_8_,(anon_class_32_3_03e05ccd *)local_68)
    ;
    return (appender)
           aVar6.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
  case hex_lower:
  case hex_upper:
    local_48 = pVar1 == hex_upper;
    if ((char)*(ushort *)&specs->field_0x9 < '\0') {
      uVar5 = (uint)(pVar1 != hex_upper) << 0xd | 0x5830;
      uVar13 = uVar5 << 8;
      if (uVar19 == 0) {
        uVar13 = uVar5;
      }
      uVar19 = (ulong)((uVar13 | uVar18) + 0x2000000);
    }
    uVar18 = 0x1f;
    if ((uVar12 | 1) != 0) {
      for (; (uVar12 | 1) >> uVar18 == 0; uVar18 = uVar18 - 1) {
      }
    }
    uVar18 = 8 - ((uVar18 ^ 0x1c) >> 2);
    uVar17 = (ulong)uVar18;
    uVar12 = specs->width;
    iVar2 = specs->precision;
    local_68._0_4_ = (undefined4)uVar19;
    if (iVar2 == -1 && uVar12 == 0) {
      if ((local_68._0_4_ != 0) && (uVar12 = local_68._0_4_ & 0xffffff, (uVar19 & 0xffffff) != 0)) {
        do {
          lVar10 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                   container + 0x10);
          uVar19 = lVar10 + 1;
          if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                               container + 0x18) < uVar19) {
            uStack_70 = (code *)0x12078e;
            (*(code *)**(undefined8 **)
                        out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)
                      (out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container);
            lVar10 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                     container + 0x10);
            uVar19 = lVar10 + 1;
          }
          *(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container
                    + 0x10) = uVar19;
          *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                    container + 8) + lVar10) = (char)uVar12;
          bVar3 = 0xff < uVar12;
          uVar12 = uVar12 >> 8;
        } while (bVar3);
      }
      uVar19 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                               container + 0x10) + uVar17;
      if (uVar19 <= *(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                     container + 0x18)) {
        *(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container +
                  0x10) = uVar19;
        if (*(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container
                     + 8) != 0) {
          pcVar8 = "0123456789abcdef";
          if (pVar1 == hex_upper) {
            pcVar8 = "0123456789ABCDEF";
          }
          pcVar14 = (char *)(uVar19 + *(long *)((long)out.
                                                  super_back_insert_iterator<fmt::v9::detail::buffer<char>_>
                                                  .container + 8));
          wVar11 = (write_int_arg<unsigned_int>)((ulong)arg & 0xffffffff);
          do {
            pcVar14 = pcVar14 + -1;
            uVar12 = arg.abs_value;
            *pcVar14 = pcVar8[uVar12 & 0xf];
            wVar11 = (write_int_arg<unsigned_int>)((ulong)wVar11 >> 4);
            arg = wVar11;
          } while (0xf < uVar12);
          return (appender)
                 out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
        }
      }
      pcVar8 = local_68 + uVar17;
      pcVar14 = "0123456789abcdef";
      if (pVar1 == hex_upper) {
        pcVar14 = "0123456789ABCDEF";
      }
      pcVar15 = (char *)((long)&uStack_70 + uVar17 + 7);
      wVar11 = (write_int_arg<unsigned_int>)((ulong)arg & 0xffffffff);
      do {
        uVar12 = arg.abs_value;
        *pcVar15 = pcVar14[uVar12 & 0xf];
        wVar11 = (write_int_arg<unsigned_int>)((ulong)wVar11 >> 4);
        pcVar15 = pcVar15 + -1;
        arg = wVar11;
      } while (0xf < uVar12);
      goto LAB_00120aaa;
    }
    iVar16 = (int)(uVar19 >> 0x18);
    uVar13 = iVar16 + uVar18;
    local_68._8_8_ = ZEXT48(uVar13);
    if ((*(ushort *)&specs->field_0x9 & 0xf) == 4) {
      if (uVar13 < uVar12) {
        local_68._16_8_ = (ulong)uVar12 - local_68._8_8_;
        local_68._8_8_ = (ulong)uVar12;
        goto LAB_00120863;
      }
    }
    else if ((int)uVar18 < iVar2) {
      local_68._8_8_ = ZEXT48((uint)(iVar16 + iVar2));
      local_68._16_8_ = ZEXT48(iVar2 - uVar18);
      goto LAB_00120863;
    }
    local_68._16_8_ = 0;
LAB_00120863:
    local_68._24_8_ = uVar17 << 0x20 | (ulong)arg & 0xffffffff;
    uStack_70 = (code *)0x12088d;
    aVar6 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::write_int<fmt::v9::appender,char,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned_int>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned_int>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_2_>(fmt::v9::appender,int,unsigned_int,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned_int>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned_int>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_2_)::_lambda(fmt::v9::appender)_1_&>
                      (out,specs,local_68._8_8_,local_68._8_8_,(anon_class_40_3_03e05ccd *)local_68)
    ;
    return (appender)
           aVar6.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
  case bin_lower:
  case bin_upper:
    if ((char)*(ushort *)&specs->field_0x9 < '\0') {
      uVar5 = (uint)(pVar1 != bin_upper) << 0xd | 0x4230;
      uVar13 = uVar5 << 8;
      if (uVar19 == 0) {
        uVar13 = uVar5;
      }
      uVar19 = (ulong)((uVar13 | uVar18) + 0x2000000);
    }
    uVar18 = 0x1f;
    if ((uVar12 | 1) != 0) {
      for (; (uVar12 | 1) >> uVar18 == 0; uVar18 = uVar18 - 1) {
      }
    }
    uVar18 = (uVar18 ^ 0xffffffe0) + 0x21;
    uVar17 = (ulong)uVar18;
    uVar12 = specs->width;
    iVar2 = specs->precision;
    local_68._0_4_ = (undefined4)uVar19;
    if (iVar2 == -1 && uVar12 == 0) {
      if ((local_68._0_4_ != 0) && (uVar12 = local_68._0_4_ & 0xffffff, (uVar19 & 0xffffff) != 0)) {
        do {
          lVar10 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                   container + 0x10);
          uVar19 = lVar10 + 1;
          if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                               container + 0x18) < uVar19) {
            uStack_70 = (code *)0x1206fb;
            (*(code *)**(undefined8 **)
                        out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)
                      (out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container);
            lVar10 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                     container + 0x10);
            uVar19 = lVar10 + 1;
          }
          *(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container
                    + 0x10) = uVar19;
          *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                    container + 8) + lVar10) = (char)uVar12;
          bVar3 = 0xff < uVar12;
          uVar12 = uVar12 >> 8;
        } while (bVar3);
      }
      uVar19 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                               container + 0x10) + uVar17;
      if (uVar19 <= *(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                     container + 0x18)) {
        *(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container +
                  0x10) = uVar19;
        if (*(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container
                     + 8) != 0) {
          pbVar7 = (byte *)(uVar19 + *(long *)((long)out.
                                                  super_back_insert_iterator<fmt::v9::detail::buffer<char>_>
                                                  .container + 8));
          wVar11 = (write_int_arg<unsigned_int>)((ulong)arg & 0xffffffff);
          do {
            pbVar7 = pbVar7 + -1;
            uVar12 = arg.abs_value;
            *pbVar7 = (byte)arg.abs_value & 1 | 0x30;
            wVar11 = (write_int_arg<unsigned_int>)((ulong)wVar11 >> 1);
            arg = wVar11;
          } while (1 < uVar12);
          return (appender)
                 out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
        }
      }
      pcVar8 = local_68 + uVar17;
      pbVar7 = (byte *)((long)&uStack_70 + uVar17 + 7);
      wVar11 = (write_int_arg<unsigned_int>)((ulong)arg & 0xffffffff);
      do {
        uVar12 = arg.abs_value;
        *pbVar7 = (byte)arg.abs_value & 1 | 0x30;
        wVar11 = (write_int_arg<unsigned_int>)((ulong)wVar11 >> 1);
        pbVar7 = pbVar7 + -1;
        arg = wVar11;
      } while (1 < uVar12);
      goto LAB_00120aaa;
    }
    iVar16 = (int)(uVar19 >> 0x18);
    uVar13 = iVar16 + uVar18;
    local_68._8_8_ = ZEXT48(uVar13);
    if ((*(ushort *)&specs->field_0x9 & 0xf) == 4) {
      if (uVar13 < uVar12) {
        local_68._16_8_ = (ulong)uVar12 - local_68._8_8_;
        local_68._8_8_ = (ulong)uVar12;
        goto LAB_00120828;
      }
    }
    else if ((int)uVar18 < iVar2) {
      local_68._8_8_ = ZEXT48((uint)(iVar16 + iVar2));
      local_68._16_8_ = ZEXT48(iVar2 - uVar18);
      goto LAB_00120828;
    }
    local_68._16_8_ = 0;
LAB_00120828:
    local_68._24_8_ = uVar17 << 0x20 | (ulong)arg & 0xffffffff;
    uStack_70 = (code *)0x12084e;
    aVar6 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::write_int<fmt::v9::appender,char,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned_int>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned_int>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_3_>(fmt::v9::appender,int,unsigned_int,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned_int>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned_int>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_3_)::_lambda(fmt::v9::appender)_1_&>
                      (out,specs,local_68._8_8_,local_68._8_8_,(anon_class_32_3_03e05ccd *)local_68)
    ;
    return (appender)
           aVar6.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
  default:
    goto switchD_0012044b_caseD_7;
  case chr:
    local_68._0_4_ = (uint)CONCAT21(local_68._2_2_,(char)arg.abs_value) << 8;
    uStack_70 = (code *)0x1206d2;
    aVar6 = write_padded<(fmt::v9::align::type)1,fmt::v9::appender,char,fmt::v9::detail::write_char<char,fmt::v9::appender>(fmt::v9::appender,char,fmt::v9::basic_format_specs<char>const&)::_lambda(fmt::v9::appender)_1_&>
                      (out,specs,1,1,(anon_class_2_2_bf5026b7 *)local_68);
    return (appender)
           aVar6.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
  }
  uVar17 = (ulong)arg & 0xffffffff;
  if ((specs->field_0xa & 1) != 0) {
    uStack_70 = (code *)0x12046e;
    bVar3 = write_int_localized<fmt::v9::appender,unsigned_long,char>
                      ((appender *)&local_38,uVar17,uVar18,specs,loc);
    if (bVar3) {
      return (appender)(back_insert_iterator<fmt::v9::detail::buffer<char>_>)local_38.container;
    }
  }
  out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container =
       (back_insert_iterator<fmt::v9::detail::buffer<char>_>)
       (back_insert_iterator<fmt::v9::detail::buffer<char>_>)local_38.container;
  uVar13 = 0x1f;
  if ((uVar12 | 1) != 0) {
    for (; (uVar12 | 1) >> uVar13 == 0; uVar13 = uVar13 - 1) {
    }
  }
  uVar5 = specs->width;
  iVar2 = specs->precision;
  iVar16 = (int)(*(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar13 * 8) + uVar17 >>
                0x20);
  if (iVar2 == -1 && uVar5 == 0) {
    if ((uVar19 != 0) && (uVar18 = uVar18 & 0xffffff, ((ulong)arg & 0xffffff00000000) != 0)) {
      do {
        sVar9 = ((buffer<char> *)
                out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)->size_;
        uVar19 = sVar9 + 1;
        if (((buffer<char> *)
            out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)->capacity_ <
            uVar19) {
          uStack_70 = (code *)0x1208b6;
          (**((buffer<char> *)
             out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)->_vptr_buffer
          )(out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container);
          sVar9 = ((buffer<char> *)
                  out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)->size_;
          uVar19 = sVar9 + 1;
        }
        ((buffer<char> *)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)->
        size_ = uVar19;
        ((buffer<char> *)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)->
        ptr_[sVar9] = (char)uVar18;
        bVar3 = 0xff < uVar18;
        uVar18 = uVar18 >> 8;
      } while (bVar3);
    }
    uStack_70 = (code *)0x1208ec;
    fVar20 = format_decimal<char,unsigned_int>(local_68,uVar12,iVar16);
    pcVar8 = fVar20.end;
LAB_00120aaa:
    uStack_70 = (code *)0x120ab2;
    aVar6 = copy_str_noinline<char,char*,fmt::v9::appender>(local_68,pcVar8,out);
    return (appender)
           aVar6.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
  }
  uVar12 = (uint)arg.prefix._3_1_ + iVar16;
  local_68._8_8_ = ZEXT48(uVar12);
  if ((*(ushort *)&specs->field_0x9 & 0xf) == 4) {
    if (uVar12 < uVar5) {
      local_68._16_8_ = (ulong)uVar5 - local_68._8_8_;
      local_68._8_8_ = (ulong)uVar5;
      goto LAB_00120978;
    }
  }
  else {
    local_68._16_8_ = ZEXT48((uint)(iVar2 - iVar16));
    if (iVar2 - iVar16 != 0 && iVar16 <= iVar2) {
      local_68._8_8_ = ZEXT48(iVar2 + (uint)arg.prefix._3_1_);
      goto LAB_00120978;
    }
  }
  local_68._16_8_ = 0;
LAB_00120978:
  local_68._24_8_ =
       *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar13 * 8) + uVar17 &
       0xffffffff00000000 | uVar17;
  uStack_70 = (code *)0x12099b;
  local_68._0_4_ = uVar18;
  aVar6 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::write_int<fmt::v9::appender,char,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned_int>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned_int>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_1_>(fmt::v9::appender,int,unsigned_int,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned_int>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned_int>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_1_)::_lambda(fmt::v9::appender)_1_&>
                    ((appender)local_38.container,specs,local_68._8_8_,local_68._8_8_,
                     (anon_class_32_3_03e05ccd *)local_68);
  return (appender)
         aVar6.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
}

Assistant:

FMT_CONSTEXPR FMT_NOINLINE auto write_int_noinline(
    OutputIt out, write_int_arg<T> arg, const basic_format_specs<Char>& specs,
    locale_ref loc) -> OutputIt {
  return write_int(out, arg, specs, loc);
}